

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O0

void __thiscall CMapLayers::PlaceEasterEggs(CMapLayers *this,CLayers *pLayers)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  CMapItemLayerTilemap *pCVar4;
  void *pvVar5;
  IMap *pIVar6;
  CLayers *in_RSI;
  CTile *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int *in_stack_00000010;
  int in_stack_00000018;
  CTile *pGameLayerTiles;
  int DataSize;
  CMapItemLayerTilemap *pGameLayer;
  undefined8 in_stack_ffffffffffffffb8;
  uint size;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  CTile *aOutTiles;
  
  size = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  aOutTiles = in_RDI;
  pCVar4 = CLayers::GameLayer(in_RSI);
  if (*(long *)(in_RDI + 0x12) != 0) {
    mem_free((void *)0x16f7f8);
  }
  uVar1 = *(undefined1 *)((long)&pCVar4->m_Width + 1);
  uVar2 = *(undefined1 *)((long)&pCVar4->m_Width + 2);
  uVar3 = *(undefined1 *)((long)&pCVar4->m_Width + 3);
  in_RDI[0x14].m_Index = *(undefined1 *)&pCVar4->m_Width;
  in_RDI[0x14].m_Flags = uVar1;
  in_RDI[0x14].m_Skip = uVar2;
  in_RDI[0x14].m_Reserved = uVar3;
  uVar1 = *(undefined1 *)((long)&pCVar4->m_Height + 1);
  uVar2 = *(undefined1 *)((long)&pCVar4->m_Height + 2);
  uVar3 = *(undefined1 *)((long)&pCVar4->m_Height + 3);
  in_RDI[0x15].m_Index = *(undefined1 *)&pCVar4->m_Height;
  in_RDI[0x15].m_Flags = uVar1;
  in_RDI[0x15].m_Skip = uVar2;
  in_RDI[0x15].m_Reserved = uVar3;
  pvVar5 = mem_alloc(0);
  *(void **)(in_RDI + 0x12) = pvVar5;
  mem_zero((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),size);
  pIVar6 = CLayers::Map(in_RSI);
  (*(pIVar6->super_IInterface)._vptr_IInterface[2])(pIVar6,(ulong)(uint)pCVar4->m_Data);
  PlaceEggDoodads(unaff_retaddr_00,unaff_retaddr,aOutTiles,(CTile *)in_RSI,
                  (int)((ulong)pCVar4 >> 0x20),(int)pCVar4,in_stack_00000010,in_stack_00000018,
                  (int)pGameLayerTiles);
  PlaceEggDoodads(unaff_retaddr_00,unaff_retaddr,aOutTiles,(CTile *)in_RSI,
                  (int)((ulong)pCVar4 >> 0x20),(int)pCVar4,in_stack_00000010,in_stack_00000018,
                  (int)pGameLayerTiles);
  PlaceEggDoodads(unaff_retaddr_00,unaff_retaddr,aOutTiles,(CTile *)in_RSI,
                  (int)((ulong)pCVar4 >> 0x20),(int)pCVar4,in_stack_00000010,in_stack_00000018,
                  (int)pGameLayerTiles);
  return;
}

Assistant:

void CMapLayers::PlaceEasterEggs(const CLayers *pLayers)
{
	CMapItemLayerTilemap *pGameLayer = pLayers->GameLayer();
	if(m_pEggTiles)
		mem_free(m_pEggTiles);

	m_EggLayerWidth = pGameLayer->m_Width;
	m_EggLayerHeight = pGameLayer->m_Height;
	int DataSize = sizeof(CTile) * m_EggLayerWidth * m_EggLayerHeight;
	m_pEggTiles = (CTile *)mem_alloc(DataSize);
	mem_zero(m_pEggTiles, DataSize);
	CTile *pGameLayerTiles = (CTile *)pLayers->Map()->GetData(pGameLayer->m_Data);

	// first pass: baskets
	static const int s_aBasketIDs[] = {
		38,
		86
	};

	static const int s_BasketCount = sizeof(s_aBasketIDs)/sizeof(s_aBasketIDs[0]);
	PlaceEggDoodads(m_EggLayerWidth, m_EggLayerHeight, m_pEggTiles, pGameLayerTiles, 3, 2, s_aBasketIDs, s_BasketCount, 250);

	// second pass: double eggs
	static const int s_aDoubleEggIDs[] = {
		9,
		25,
		41,
		57,
		73,
		89
	};

	static const int s_DoubleEggCount = sizeof(s_aDoubleEggIDs)/sizeof(s_aDoubleEggIDs[0]);
	PlaceEggDoodads(m_EggLayerWidth, m_EggLayerHeight, m_pEggTiles, pGameLayerTiles, 2, 1, s_aDoubleEggIDs, s_DoubleEggCount, 100);

	// third pass: eggs
	static const int s_aEggIDs[] = {
		1, 2, 3, 4, 5,
		17, 18, 19, 20,
		33, 34, 35, 36,
		49, 50,     52,
		65, 66,
			82,
			98
	};

	static const int s_EggCount = sizeof(s_aEggIDs)/sizeof(s_aEggIDs[0]);
	PlaceEggDoodads(m_EggLayerWidth, m_EggLayerHeight, m_pEggTiles, pGameLayerTiles, 1, 1, s_aEggIDs, s_EggCount, 30);
}